

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

void minja::Value::dump_string(json *primitive,ostringstream *out,char string_quote)

{
  long lVar1;
  ostream *poVar2;
  runtime_error *this;
  ulong uVar3;
  string_t s;
  string_t local_68;
  string_t local_48;
  
  if ((primitive->m_data).m_type != string) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(&local_48,primitive,-1,' ',false,strict);
    std::operator+(&local_68,"Value is not a string: ",&local_48);
    std::runtime_error::runtime_error(this,(string *)&local_68);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump(&local_68,primitive,-1,' ',false,strict);
  if (string_quote != '\"') {
    lVar1 = std::__cxx11::string::find((char)&local_68,0x27);
    if (lVar1 == -1) {
      local_48._M_dataplus._M_p._0_1_ = string_quote;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_48,1);
      if (1 < local_68._M_string_length - 1) {
        uVar3 = 1;
        do {
          local_48._M_dataplus._M_p._0_1_ = local_68._M_dataplus._M_p[uVar3];
          if (((char)local_48._M_dataplus._M_p == '\\') &&
             (local_68._M_dataplus._M_p[uVar3 + 1] == '\"')) {
            local_48._M_dataplus._M_p._0_1_ = 0x22;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_48,1);
            uVar3 = uVar3 + 1;
          }
          else if ((char)local_48._M_dataplus._M_p == string_quote) {
            local_48._M_dataplus._M_p._0_1_ = 0x5c;
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)out,(char *)&local_48,1);
            local_48._M_dataplus._M_p._0_1_ = string_quote;
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_48,1);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_68._M_string_length - 1);
      }
      local_48._M_dataplus._M_p._0_1_ = string_quote;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_48,1);
      goto LAB_001655ea;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
LAB_001655ea:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void dump_string(const json & primitive, std::ostringstream & out, char string_quote = '\'') {
    if (!primitive.is_string()) throw std::runtime_error("Value is not a string: " + primitive.dump());
    auto s = primitive.dump();
    if (string_quote == '"' || s.find('\'') != std::string::npos) {
      out << s;
      return;
    }
    // Reuse json dump, just changing string quotes
    out << string_quote;
    for (size_t i = 1, n = s.size() - 1; i < n; ++i) {
      if (s[i] == '\\' && s[i + 1] == '"') {
        out << '"';
        i++;
      } else if (s[i] == string_quote) {
        out << '\\' << string_quote;
      } else {
        out << s[i];
      }
    }
    out << string_quote;
  }